

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O1

bool spvParseVulkanEnv(uint32_t vulkan_ver,uint32_t spirv_ver,spv_target_env_conflict *env)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = true;
  lVar2 = 8;
  while ((*(uint *)(&UNK_008f293c + lVar2) < vulkan_ver ||
         (*(uint *)((long)&ordered_vulkan_envs[0].vulkan_env + lVar2) < spirv_ver))) {
    lVar2 = lVar2 + 0xc;
    bVar1 = lVar2 != 0x50;
    if (!bVar1) {
      return bVar1;
    }
  }
  *env = *(spv_target_env_conflict *)((long)ordered_universal_envs._M_elems + lVar2 + 0x18);
  return bVar1;
}

Assistant:

bool spvParseVulkanEnv(uint32_t vulkan_ver, uint32_t spirv_ver,
                       spv_target_env* env) {
  for (auto triple : ordered_vulkan_envs) {
    if (triple.vulkan_ver >= vulkan_ver && triple.spirv_ver >= spirv_ver) {
      *env = triple.vulkan_env;
      return true;
    }
  }
  return false;
}